

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::GeomCamera::Projection>::add_sample
          (TypedTimeSamples<tinyusdz::GeomCamera::Projection> *this,double t,Projection *v)

{
  Sample s;
  Sample local_18;
  
  local_18.blocked = false;
  local_18.value = *v;
  local_18.t = t;
  ::std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::GeomCamera::Projection>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomCamera::Projection>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<tinyusdz::GeomCamera::Projection>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<tinyusdz::GeomCamera::Projection>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomCamera::Projection>::Sample>>
              *)this,&local_18);
  this->_dirty = true;
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }